

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O3

int hts_itr_next(BGZF *fp,hts_itr_t *iter,void *r,void *data)

{
  hts_pair64_t *phVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  uint64_t pos;
  int end;
  int beg;
  int tid;
  int local_3c;
  int local_38;
  int local_34;
  
  iVar3 = -1;
  if ((iter != (hts_itr_t *)0x0) &&
     (iVar3 = -1, ((undefined1  [80])*iter & (undefined1  [80])0x2) == (undefined1  [80])0x0)) {
    if (((undefined1  [80])*iter & (undefined1  [80])0x1) == (undefined1  [80])0x0) {
      if (iter->off != (hts_pair64_t *)0x0) {
        uVar4 = iter->curr_off;
        do {
          uVar2 = iter->i;
          if ((uVar4 == 0) || (iter->off[(int)uVar2].v <= uVar4)) {
            if (uVar2 == iter->n_off - 1U) {
              iVar5 = -1;
              goto LAB_00111775;
            }
            phVar1 = iter->off;
            if ((int)uVar2 < 0) {
              pos = phVar1[(long)(int)uVar2 + 1].u;
LAB_0011168c:
              bgzf_seek(fp,pos,0);
              iter->curr_off = (ulong)(ushort)fp->block_offset | fp->block_address << 0x10;
              uVar2 = iter->i;
            }
            else {
              pos = phVar1[(ulong)uVar2 + 1].u;
              if (phVar1[uVar2].v != pos) goto LAB_0011168c;
            }
            iter->i = uVar2 + 1;
          }
          iVar3 = (*iter->readrec)(fp,data,r,&local_34,&local_38,&local_3c);
          iVar5 = iVar3;
          if (iVar3 < 0) {
LAB_00111775:
            *(byte *)iter = *(byte *)iter | 2;
            return iVar5;
          }
          uVar4 = (ulong)(ushort)fp->block_offset | fp->block_address << 0x10;
          iter->curr_off = uVar4;
          iVar5 = -1;
          if ((local_34 != iter->tid) || (iter->end <= local_38)) goto LAB_00111775;
        } while (local_3c <= iter->beg);
        iter->curr_tid = local_34;
        iter->curr_beg = local_38;
        iter->curr_end = local_3c;
      }
    }
    else {
      if (iter->curr_off != 0) {
        bgzf_seek(fp,iter->curr_off,0);
        iter->curr_off = 0;
      }
      iVar3 = (*iter->readrec)(fp,data,r,&local_34,&local_38,&local_3c);
      if (iVar3 < 0) {
        *(byte *)iter = *(byte *)iter | 2;
      }
      iter->curr_tid = local_34;
      iter->curr_beg = local_38;
      iter->curr_end = local_3c;
    }
  }
  return iVar3;
}

Assistant:

int hts_itr_next(BGZF *fp, hts_itr_t *iter, void *r, void *data)
{
    int ret, tid, beg, end;
    if (iter == NULL || iter->finished) return -1;
    if (iter->read_rest) {
        if (iter->curr_off) { // seek to the start
            bgzf_seek(fp, iter->curr_off, SEEK_SET);
            iter->curr_off = 0; // only seek once
        }
        ret = iter->readrec(fp, data, r, &tid, &beg, &end);
        if (ret < 0) iter->finished = 1;
        iter->curr_tid = tid;
        iter->curr_beg = beg;
        iter->curr_end = end;
        return ret;
    }
    if (iter->off == 0) return -1;
    for (;;) {
        if (iter->curr_off == 0 || iter->curr_off >= iter->off[iter->i].v) { // then jump to the next chunk
            if (iter->i == iter->n_off - 1) { ret = -1; break; } // no more chunks
            if (iter->i < 0 || iter->off[iter->i].v != iter->off[iter->i+1].u) { // not adjacent chunks; then seek
                bgzf_seek(fp, iter->off[iter->i+1].u, SEEK_SET);
                iter->curr_off = bgzf_tell(fp);
            }
            ++iter->i;
        }
        if ((ret = iter->readrec(fp, data, r, &tid, &beg, &end)) >= 0) {
            iter->curr_off = bgzf_tell(fp);
            if (tid != iter->tid || beg >= iter->end) { // no need to proceed
                ret = -1; break;
            } else if (end > iter->beg && iter->end > beg) {
                iter->curr_tid = tid;
                iter->curr_beg = beg;
                iter->curr_end = end;
                return ret;
            }
        } else break; // end of file or error
    }
    iter->finished = 1;
    return ret;
}